

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O1

void __thiscall OpenMD::VectorAccumulator::clear(VectorAccumulator *this)

{
  undefined8 uVar1;
  
  (this->super_BaseAccumulator).Count_ = 0;
  if (&this->Avg_ != (ResultType *)OpenMD::V3Zero) {
    (this->Avg_).super_Vector<double,_3U>.data_[2] = (double)OpenMD::V3Zero._16_8_;
    uVar1 = OpenMD::V3Zero._8_8_;
    (this->Avg_).super_Vector<double,_3U>.data_[0] = (double)OpenMD::V3Zero._0_8_;
    (this->Avg_).super_Vector<double,_3U>.data_[1] = (double)uVar1;
  }
  if (&this->Avg2_ != (ResultType *)OpenMD::V3Zero) {
    (this->Avg2_).super_Vector<double,_3U>.data_[2] = (double)OpenMD::V3Zero._16_8_;
    uVar1 = OpenMD::V3Zero._8_8_;
    (this->Avg2_).super_Vector<double,_3U>.data_[0] = (double)OpenMD::V3Zero._0_8_;
    (this->Avg2_).super_Vector<double,_3U>.data_[1] = (double)uVar1;
  }
  if (&this->Total_ != (ResultType *)OpenMD::V3Zero) {
    (this->Total_).super_Vector<double,_3U>.data_[2] = (double)OpenMD::V3Zero._16_8_;
    uVar1 = OpenMD::V3Zero._8_8_;
    (this->Total_).super_Vector<double,_3U>.data_[0] = (double)OpenMD::V3Zero._0_8_;
    (this->Total_).super_Vector<double,_3U>.data_[1] = (double)uVar1;
  }
  if (&this->Val_ != (ResultType *)OpenMD::V3Zero) {
    (this->Val_).super_Vector<double,_3U>.data_[2] = (double)OpenMD::V3Zero._16_8_;
    uVar1 = OpenMD::V3Zero._8_8_;
    (this->Val_).super_Vector<double,_3U>.data_[0] = (double)OpenMD::V3Zero._0_8_;
    (this->Val_).super_Vector<double,_3U>.data_[1] = (double)uVar1;
  }
  this->AvgLen_ = 0.0;
  this->AvgLen2_ = 0.0;
  return;
}

Assistant:

void clear() {
      Count_   = 0;
      Avg_     = V3Zero;
      Avg2_    = V3Zero;
      Total_   = V3Zero;
      Val_     = V3Zero;
      AvgLen_  = 0;
      AvgLen2_ = 0;
    }